

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregorian.cpp
# Opt level: O3

int __thiscall
booster::locale::util::gregorian_calendar::get_value
          (gregorian_calendar *this,period_mark p,value_type v)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  
  switch(p) {
  case era:
    goto switchD_001a7986_caseD_1;
  case year:
  case extended_year:
    if (v < current) {
      return 1;
    }
    if (2 < v - least_maximum) {
      if (v == current) {
        return (this->tm_).tm_year + 0x76c;
      }
      return 0;
    }
    return 0x7fffffff;
  case month:
    if (greatest_minimum < v) {
      if (v - least_maximum < 3) {
        return 0xb;
      }
      if (v == current) {
        return (this->tm_).tm_mon;
      }
    }
    break;
  case day:
    p = era;
    switch(v) {
    case absolute_minimum:
    case actual_minimum:
    case greatest_minimum:
      goto switchD_001a7986_caseD_1;
    case current:
      return (this->tm_).tm_mday;
    case least_maximum:
      return 0x1c;
    case actual_maximum:
      uVar2 = (this->tm_).tm_year;
      uVar4 = uVar2 * -0x3d70a3d7 + 0x51eb89c;
      if ((uVar4 >> 4 | uVar4 * 0x10000000) < 0xa3d70b) {
        uVar2 = 1;
      }
      else if (((uVar2 + 0x76c) * -0x3d70a3d7 + 0x51eb850 >> 2 | uVar2 * 0x40000000) < 0x28f5c29) {
        uVar2 = 0;
      }
      else {
        uVar2 = (uint)((uVar2 & 3) == 0);
      }
      return *(int *)((anonymous_namespace)::days_in_month(int,int)::tbl +
                     (long)(this->tm_).tm_mon * 4 + (ulong)(uVar2 * 0x30));
    case absolute_maximum:
      return 0x1f;
    default:
      break;
    }
  case day_of_year:
    p = era;
    switch(v) {
    case absolute_minimum:
    case actual_minimum:
    case greatest_minimum:
      goto switchD_001a7986_caseD_1;
    case current:
      uVar2 = (this->tm_).tm_yday;
      goto LAB_001a8097;
    case least_maximum:
      return 0x16d;
    case actual_maximum:
      uVar2 = (this->tm_).tm_year;
      uVar4 = uVar2 * -0x3d70a3d7 + 0x51eb89c;
      if (0xa3d70a < (uVar4 >> 4 | uVar4 * 0x10000000)) {
        return ((uVar2 & 3) == 0 &&
               0x28f5c28 < ((uVar2 + 0x76c) * -0x3d70a3d7 + 0x51eb850 >> 2 | uVar2 * 0x40000000)) +
               0x16d;
      }
    case absolute_maximum:
      return 0x16e;
    default:
      break;
    }
  case day_of_week:
    if (v < current) {
      return 1;
    }
    if (v - least_maximum < 3) {
      return 7;
    }
    if (v == current) {
      uVar2 = (this->tm_).tm_wday;
      goto LAB_001a8097;
    }
    break;
  case day_of_week_in_month:
    switch(v) {
    case absolute_minimum:
    case actual_minimum:
    case greatest_minimum:
      return 1;
    case current:
      iVar1 = (this->tm_).tm_mday;
      iVar1 = iVar1 + (int)((ulong)((long)(iVar1 + -1) * -0x6db6db6d) >> 0x20) + -1;
      return ((iVar1 >> 2) - (iVar1 >> 0x1f)) + 1;
    case least_maximum:
switchD_001a7b4e_caseD_4:
      return 4;
    case actual_maximum:
      if ((this->tm_).tm_mon != 1) {
        return 5;
      }
      uVar2 = (this->tm_).tm_year;
      uVar4 = uVar2 * -0x3d70a3d7 + 0x51eb89c;
      if ((uVar4 >> 4 | uVar4 * 0x10000000) < 0xa3d70b) {
        return 5;
      }
      if ((uVar2 & 3) != 0) {
        return 4;
      }
      if (uVar2 + 0x76c == ((int)(uVar2 + 0x76c) / 100) * 100) {
        return 4;
      }
      return 5;
    case absolute_maximum:
switchD_001a7b4e_caseD_6:
      return 5;
    }
    break;
  case day_of_week_local:
    if (v < current) {
      return 1;
    }
    if (v - least_maximum < 3) {
      return 7;
    }
    if (v == current) {
      iVar1 = (this->tm_).tm_wday - this->first_day_of_week_;
      iVar3 = (int)((ulong)((long)(iVar1 + 7) * -0x6db6db6d) >> 0x20) + iVar1 + 7;
      return iVar1 + ((iVar3 >> 2) - (iVar3 >> 0x1f)) * -7 + 8;
    }
    break;
  case hour:
    if (greatest_minimum < v) {
      if (v - least_maximum < 3) {
        return 0x17;
      }
      if (v == current) {
        return (this->tm_).tm_hour;
      }
    }
    break;
  case hour_12:
    if (greatest_minimum < v) {
      if (v - least_maximum < 3) {
        return 0xb;
      }
      if (v == current) {
        iVar1 = (this->tm_).tm_hour;
        return iVar1 + (((uint)(iVar1 / 6 + (iVar1 >> 0x1f)) >> 1) - (iVar1 >> 0x1f)) * -0xc;
      }
    }
    break;
  case am_pm:
    if (greatest_minimum < v) {
      if (v - least_maximum < 3) {
        return 1;
      }
      if (v == current) {
        return (uint)(0xb < (this->tm_).tm_hour);
      }
    }
    break;
  case minute:
    if (greatest_minimum < v) {
      if (v - least_maximum < 3) {
        return 0x3b;
      }
      if (v == current) {
        return (this->tm_).tm_min;
      }
    }
    break;
  case second:
    if (greatest_minimum < v) {
      if (v - least_maximum < 3) {
        return 0x3b;
      }
      if (v == current) {
        return (this->tm_).tm_sec;
      }
    }
    break;
  case week_of_year:
    p = era;
    switch(v) {
    case absolute_minimum:
    case actual_minimum:
    case greatest_minimum:
      goto switchD_001a7986_caseD_1;
    case current:
      iVar1 = (this->tm_).tm_yday;
      iVar3 = (this->tm_).tm_wday - this->first_day_of_week_;
      iVar5 = (int)((ulong)((long)(iVar3 + 7) * -0x6db6db6d) >> 0x20) + iVar3 + 7;
      iVar3 = (iVar3 + ((iVar5 >> 2) - (iVar5 >> 0x1f)) * -7 + 7) - iVar1;
      iVar5 = (int)((ulong)((long)(iVar3 + 700) * -0x6db6db6d) >> 0x20) + iVar3 + 700;
      iVar5 = iVar3 + ((iVar5 >> 2) - (iVar5 >> 0x1f)) * -7 + 700;
      iVar3 = -7;
      if (iVar5 < 4) {
        iVar3 = 0;
      }
      uVar2 = iVar5 + iVar1 + iVar3;
      if ((int)uVar2 < 0) {
        return 0x35;
      }
      goto LAB_001a8081;
    case least_maximum:
      return 0x34;
    case actual_maximum:
      uVar2 = (this->tm_).tm_year;
      uVar4 = uVar2 * -0x3d70a3d7 + 0x51eb89c;
      if ((uVar4 >> 4 | uVar4 * 0x10000000) < 0xa3d70b) {
        uVar2 = 0x16d;
      }
      else {
        uVar2 = ((uVar2 & 3) == 0 &&
                0x28f5c28 < ((uVar2 + 0x76c) * -0x3d70a3d7 + 0x51eb850 >> 2 | uVar2 * 0x40000000)) |
                0x16c;
      }
      iVar1 = (int)((uVar2 - (this->tm_).tm_yday) + (this->tm_).tm_wday) % 7 -
              this->first_day_of_week_;
      iVar3 = (int)((ulong)((long)(iVar1 + 7) * -0x6db6db6d) >> 0x20) + iVar1 + 7;
      iVar1 = (((iVar3 >> 2) - (iVar3 >> 0x1f)) * -7 + iVar1 + 7) - uVar2;
      uVar4 = iVar1 + 700;
      uVar6 = (uVar4 & 0xffff) * 0x2493 >> 0x10;
      iVar1 = iVar1 + (((uVar4 - uVar6 & 0xffff) >> 1) + uVar6 >> 2) * -7 + 700;
      uVar4 = uVar2 + 0xfff9;
      if ((ushort)iVar1 < 4) {
        uVar4 = uVar2;
      }
      uVar4 = uVar4 + iVar1;
      uVar2 = (uVar4 & 0xffff) * 0x2493 >> 0x10;
      uVar2 = ((uVar4 - uVar2 & 0xffff) >> 1) + uVar2;
      break;
    case absolute_maximum:
      return 0x35;
    default:
      goto switchD_001a7986_default;
    }
    goto LAB_001a8094;
  case week_of_month:
    p = era;
    switch(v) {
    case absolute_minimum:
    case actual_minimum:
    case greatest_minimum:
      goto switchD_001a7986_caseD_1;
    case current:
      iVar1 = (this->tm_).tm_mday;
      iVar3 = (this->tm_).tm_wday - this->first_day_of_week_;
      iVar5 = (int)((ulong)((long)(iVar3 + 7) * -0x6db6db6d) >> 0x20) + iVar3 + 7;
      iVar3 = (iVar3 + ((iVar5 >> 2) - (iVar5 >> 0x1f)) * -7 + 7) - iVar1;
      iVar5 = (int)((ulong)((long)(iVar3 + 700) * -0x6db6db6d) >> 0x20) + iVar3 + 700;
      iVar5 = iVar3 + ((iVar5 >> 2) - (iVar5 >> 0x1f)) * -7 + 700;
      iVar3 = -7;
      if (iVar5 < 4) {
        iVar3 = 0;
      }
      uVar2 = iVar5 + iVar1 + iVar3;
      if ((int)uVar2 < 0) {
        return 5;
      }
      break;
    case least_maximum:
      goto switchD_001a7b4e_caseD_4;
    case actual_maximum:
      uVar2 = (this->tm_).tm_year;
      uVar4 = uVar2 * -0x3d70a3d7 + 0x51eb89c;
      if ((uVar4 >> 4 | uVar4 * 0x10000000) < 0xa3d70b) {
        uVar2 = 1;
      }
      else if (((uVar2 + 0x76c) * -0x3d70a3d7 + 0x51eb850 >> 2 | uVar2 * 0x40000000) < 0x28f5c29) {
        uVar2 = 0;
      }
      else {
        uVar2 = (uint)((uVar2 & 3) == 0);
      }
      iVar1 = *(int *)((anonymous_namespace)::days_in_month(int,int)::tbl +
                      (long)(this->tm_).tm_mon * 4 + (ulong)(uVar2 * 0x30));
      iVar3 = ((iVar1 - (this->tm_).tm_mday) + (this->tm_).tm_wday) % 7 - this->first_day_of_week_;
      iVar5 = (int)((ulong)((long)(iVar3 + 7) * -0x6db6db6d) >> 0x20) + iVar3 + 7;
      iVar3 = (iVar3 + ((iVar5 >> 2) - (iVar5 >> 0x1f)) * -7 + 7) - iVar1;
      iVar5 = (int)((ulong)((long)(iVar3 + 700) * -0x6db6db6d) >> 0x20) + iVar3 + 700;
      iVar5 = iVar3 + ((iVar5 >> 2) - (iVar5 >> 0x1f)) * -7 + 700;
      iVar3 = -7;
      if (iVar5 < 4) {
        iVar3 = 0;
      }
      uVar2 = iVar5 + iVar1 + iVar3;
      if ((int)uVar2 < 0) {
        return -1;
      }
      break;
    case absolute_maximum:
      goto switchD_001a7b4e_caseD_6;
    default:
      goto switchD_001a7986_default;
    }
LAB_001a8081:
    uVar2 = (uint)((ulong)uVar2 * 0x124924925 >> 0x21);
LAB_001a8094:
    uVar2 = uVar2 >> 2;
LAB_001a8097:
    return uVar2 + 1;
  case first_day_of_week:
    uVar2 = this->first_day_of_week_;
    goto LAB_001a8097;
  }
switchD_001a7986_default:
  return 0;
switchD_001a7986_caseD_1:
  return p;
}

Assistant:

virtual int get_value(period::marks::period_mark p,value_type v) const 
            {
                using namespace period::marks;
                switch(p) {
                case era:
                    return 1;
                case year:
                case extended_year:
                    switch(v) {
                    case absolute_minimum:
                    case greatest_minimum:
                    case actual_minimum:
                        #ifdef BOOSTER_WIN_NATIVE
                        return 1970; // Unix epoch windows can't handle negative time_t
                        #else
                        if(sizeof(std::time_t) == 4)
                            return 1901; // minimal year with 32 bit time_t
                        else
                            return 1; 
                        #endif
                    case absolute_maximum:
                    case least_maximum:
                    case actual_maximum:
                        if(sizeof(std::time_t) == 4)
                            return 2038; // Y2K38 - maximal with 32 bit time_t
                        else
                            return std::numeric_limits<int>::max();
                    case current:
                        return tm_.tm_year + 1900;
                    };
                    break;
                case month:
                    switch(v) {
                    case absolute_minimum:
                    case greatest_minimum:
                    case actual_minimum:
                        return 0;
                    case absolute_maximum:
                    case least_maximum:
                    case actual_maximum:
                        return 11;
                    case current:
                        return tm_.tm_mon;
                    };
                    break;
                case day:
                    switch(v) {
                    case absolute_minimum:
                    case greatest_minimum:
                    case actual_minimum:
                        return 1;
                    case absolute_maximum:
                        return 31;
                    case least_maximum:
                        return 28;
                    case actual_maximum:
                        return days_in_month(tm_.tm_year + 1900,tm_.tm_mon + 1);
                    case current:
                        return tm_.tm_mday;
                    };
                    break;
                case day_of_year:                ///< The number of day in year, starting from 1
                    switch(v) {
                    case absolute_minimum:
                    case greatest_minimum:
                    case actual_minimum:
                        return 1;
                    case absolute_maximum:
                        return 366;
                    case least_maximum:
                        return 365;
                    case actual_maximum:
                        return is_leap(tm_.tm_year + 1900) ? 366 : 365;
                    case current:
                        return tm_.tm_yday + 1;
                    }
                    break;
                case day_of_week:                ///< Day of week, starting from Sunday, [1..7]
                    switch(v) {
                    case absolute_minimum:
                    case greatest_minimum:
                    case actual_minimum:
                        return 1;
                    case absolute_maximum:
                    case least_maximum:
                    case actual_maximum:
                        return 7;
                    case current:
                        return tm_.tm_wday + 1;
                    }
                    break;
                case day_of_week_local:     ///< Local day of week, for example in France Monday is 1, in US Sunday is 1, [1..7]
                    switch(v) {
                    case absolute_minimum:
                    case greatest_minimum:
                    case actual_minimum:
                        return 1;
                    case absolute_maximum:
                    case least_maximum:
                    case actual_maximum:
                        return 7;
                    case current:
                        return (tm_.tm_wday - first_day_of_week_ + 7) % 7 + 1;
                    }
                    break;
                case hour:                       ///< 24 clock hour [0..23]
                    switch(v) {
                    case absolute_minimum:
                    case greatest_minimum:
                    case actual_minimum:
                        return 0;
                    case absolute_maximum:
                    case least_maximum:
                    case actual_maximum:
                        return 23;
                    case current:
                        return tm_.tm_hour;
                    }
                    break;
                case hour_12:                    ///< 12 clock hour [0..11]
                    switch(v) {
                    case absolute_minimum:
                    case greatest_minimum:
                    case actual_minimum:
                        return 0;
                    case absolute_maximum:
                    case least_maximum:
                    case actual_maximum:
                        return 11;
                    case current:
                        return tm_.tm_hour % 12;
                    }
                    break;
                case am_pm:                      ///< am or pm marker, [0..1]
                    switch(v) {
                    case absolute_minimum:
                    case greatest_minimum:
                    case actual_minimum:
                        return 0;
                    case absolute_maximum:
                    case least_maximum:
                    case actual_maximum:
                        return 1;
                    case current:
                        return tm_.tm_hour >= 12 ? 1 : 0;
                    }
                    break;
                case minute:                     ///< minute [0..59]
                    switch(v) {
                    case absolute_minimum:
                    case greatest_minimum:
                    case actual_minimum:
                        return 0;
                    case absolute_maximum:
                    case least_maximum:
                    case actual_maximum:
                        return 59;
                    case current:
                        return tm_.tm_min;
                    }
                    break;
                case second:                     ///< second [0..59]
                    switch(v) {
                    case absolute_minimum:
                    case greatest_minimum:
                    case actual_minimum:
                        return 0;
                    case absolute_maximum:
                    case least_maximum:
                    case actual_maximum:
                        return 59;
                    case current:
                        return tm_.tm_sec;
                    }
                    break;
                case period::marks::first_day_of_week:          ///< For example Sunday in US, Monday in France
                    return first_day_of_week_ + 1;
                
                case week_of_year:               ///< The week number in the year
                    switch(v) {
                    case absolute_minimum:
                    case greatest_minimum:
                    case actual_minimum:
                        return 1;
                    case absolute_maximum:
                        return 53;
                    case least_maximum:
                        return 52;
                    case actual_maximum:
                        {
                            int year = tm_.tm_year + 1900;
                            int end_of_year_days = (is_leap(year) ? 366 : 365) - 1;
                            int dow_of_end_of_year = (end_of_year_days - tm_.tm_yday + tm_.tm_wday) % 7;
                            return get_week_number(end_of_year_days,dow_of_end_of_year);
                        }
                    case current:
                        {
                            int val = get_week_number(tm_.tm_yday,tm_.tm_wday);
                            if(val < 0)
                                return 53;
                            return val;
                        }
                    }
                case week_of_month:              ///< The week number withing current month
                    switch(v) {
                    case absolute_minimum:
                    case greatest_minimum:
                    case actual_minimum:
                        return 1;
                    case absolute_maximum:
                        return 5;
                    case least_maximum:
                        return 4;
                    case actual_maximum:
                        {
                            int end_of_month_days = days_in_month(tm_.tm_year + 1900,tm_.tm_mon + 1);
                            int dow_of_end_of_month = (end_of_month_days - tm_.tm_mday + tm_.tm_wday) % 7;
                            return get_week_number(end_of_month_days,dow_of_end_of_month);
                        }
                    case current:
                        {
                            int val = get_week_number(tm_.tm_mday,tm_.tm_wday);
                            if(val < 0)
                                return 5;
                            return val;
                        }
                    }

                case day_of_week_in_month:       ///< Original number of the day of the week in month.
                    switch(v) {
                    case absolute_minimum:
                    case greatest_minimum:
                    case actual_minimum:
                        return 1;
                    case absolute_maximum:
                        return 5;
                    case least_maximum:
                        return 4;
                    case actual_maximum:
                        if(tm_.tm_mon == 1 && !is_leap(tm_.tm_year + 1900)) {
                            // only in february in non leap year is 28 days, the rest
                            // conver more then 4 weeks
                            return 4;
                        }
                        return 5;
                    case current:
                        return (tm_.tm_mday - 1) / 7 + 1;
                    default:
                        ;
                    }
                default:
                    ;
                }
                return 0;
 
            }